

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_platform_unix.c
# Opt level: O0

char * readSymLink(char *path)

{
  char *__buf;
  ssize_t sVar1;
  char *ptr;
  char *retval;
  ssize_t rc;
  ssize_t len;
  char *path_local;
  
  rc = 0x40;
  ptr = (char *)0x0;
  while ((__buf = (char *)(*__PHYSFS_AllocatorHooks.Realloc)(ptr,rc), __buf != (char *)0x0 &&
         (sVar1 = readlink(path,__buf,rc), ptr = __buf, sVar1 != -1))) {
    if (sVar1 < rc) {
      __buf[sVar1] = '\0';
      return __buf;
    }
    rc = rc << 1;
  }
  if (ptr != (char *)0x0) {
    (*__PHYSFS_AllocatorHooks.Free)(ptr);
  }
  return (char *)0x0;
}

Assistant:

static char *readSymLink(const char *path)
{
    ssize_t len = 64;
    ssize_t rc = -1;
    char *retval = NULL;

    while (1)
    {
         char *ptr = (char *) allocator.Realloc(retval, (size_t) len);
         if (ptr == NULL)
             break;   /* out of memory. */
         retval = ptr;

         rc = readlink(path, retval, len);
         if (rc == -1)
             break;  /* not a symlink, i/o error, etc. */

         else if (rc < len)
         {
             retval[rc] = '\0';  /* readlink doesn't null-terminate. */
             return retval;  /* we're good to go. */
         } /* else if */

         len *= 2;  /* grow buffer, try again. */
    } /* while */

    if (retval != NULL)
        allocator.Free(retval);
    return NULL;
}